

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O2

void work_mgga_fxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  size_t sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double __x;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  undefined1 auVar52 [16];
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  undefined1 auVar114 [16];
  double dVar116;
  undefined1 auVar115 [16];
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar148;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  undefined1 auVar197 [16];
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double local_f50;
  double local_f28;
  double local_f10;
  double local_e98;
  double local_e18;
  double local_d48;
  double local_b78;
  double local_a88;
  double local_978;
  double local_968;
  double local_688;
  double local_5a8;
  
  local_f50 = 0.0;
  local_f28 = 0.0;
  local_a88 = 0.0;
  local_e18 = 0.0;
  for (sVar10 = 0; np != sVar10; sVar10 = sVar10 + 1) {
    lVar6 = (long)(p->dim).rho * sVar10;
    dVar21 = rho[lVar6];
    if (p->nspin == 2) {
      dVar21 = dVar21 + rho[lVar6 + 1];
    }
    dVar132 = p->dens_threshold;
    if (dVar132 <= dVar21) {
      dVar21 = rho[lVar6];
      if (rho[lVar6] <= dVar132) {
        dVar21 = dVar132;
      }
      dVar22 = p->sigma_threshold * p->sigma_threshold;
      lVar9 = (long)(p->dim).sigma * sVar10;
      local_f10 = sigma[lVar9];
      if (sigma[lVar9] <= dVar22) {
        local_f10 = dVar22;
      }
      uVar2 = p->info->flags;
      if ((uVar2 >> 0x10 & 1) != 0) {
        local_a88 = tau[(long)(p->dim).tau * sVar10];
        if (tau[(long)(p->dim).tau * sVar10] <= p->tau_threshold) {
          local_a88 = p->tau_threshold;
        }
        if (((uVar2 >> 0x11 & 1) != 0) && (dVar53 = dVar21 * 8.0 * local_a88, dVar53 <= local_f10))
        {
          local_f10 = dVar53;
        }
      }
      if (p->nspin == 2) {
        local_f50 = rho[lVar6 + 1];
        if (rho[lVar6 + 1] <= dVar132) {
          local_f50 = dVar132;
        }
        local_f28 = sigma[lVar9 + 2];
        if (sigma[lVar9 + 2] <= dVar22) {
          local_f28 = dVar22;
        }
        if ((uVar2 >> 0x10 & 1) != 0) {
          local_e18 = tau[(long)(p->dim).tau * sVar10 + 1];
          if (tau[(long)(p->dim).tau * sVar10 + 1] <= p->tau_threshold) {
            local_e18 = p->tau_threshold;
          }
          if (((uVar2 >> 0x11 & 1) != 0) &&
             (dVar22 = local_f50 * 8.0 * local_e18, dVar22 <= local_f28)) {
            local_f28 = dVar22;
          }
        }
      }
      __x = dVar21 + local_f50;
      dVar92 = 1.0 / __x;
      dVar54 = (dVar21 + dVar21) * dVar92;
      dVar22 = p->zeta_threshold;
      local_e98 = dVar22 + -1.0;
      dVar150 = (local_f50 + local_f50) * dVar92;
      dVar134 = dVar21 - local_f50;
      uVar15 = -(ulong)(dVar150 <= dVar22);
      dVar53 = local_e98;
      if (dVar22 < dVar54) {
        dVar53 = (double)(~uVar15 & (ulong)(dVar134 * dVar92) | uVar15 & (ulong)-local_e98);
      }
      pdVar3 = (double *)p->params;
      dVar53 = dVar53 + 1.0;
      dVar23 = cbrt(dVar22);
      dVar24 = cbrt(dVar53);
      dVar25 = cbrt(__x);
      dVar55 = pdVar3[0xc] * dVar25;
      dVar26 = cbrt(9.869604401089358);
      dVar27 = cbrt(dVar21);
      uVar16 = -(ulong)(dVar53 <= dVar22);
      dVar155 = (double)(uVar16 & (ulong)(dVar23 * dVar22) | ~uVar16 & (ulong)(dVar24 * dVar53));
      dVar56 = 1.0 / (dVar26 * dVar26);
      dVar57 = dVar56 * 1.8171205928321397;
      dVar93 = dVar21 * dVar21;
      dVar167 = dVar26 * dVar26 * 0.9905781746683879;
      dVar58 = 1.0 / (dVar27 * dVar27);
      dVar151 = dVar58 / dVar21;
      dVar209 = dVar167 - local_a88 * dVar151;
      dVar59 = dVar58 / dVar93;
      dVar135 = local_f10 * dVar57 * 0.009146457198521547 * dVar59 + 0.804;
      dVar94 = 1.804 - 0.646416 / dVar135;
      dVar28 = local_a88 * dVar151 + dVar167;
      dVar60 = dVar28 * dVar28;
      dVar232 = dVar60 * dVar60;
      dVar152 = 1.0 / (dVar232 * dVar232);
      dVar198 = dVar209 * dVar209;
      dVar168 = dVar198 * dVar198;
      dVar136 = dVar168 * dVar209;
      dVar148 = dVar168 * dVar168;
      dVar186 = dVar209 * dVar148;
      dVar1 = pdVar3[2];
      dVar88 = pdVar3[9];
      dVar204 = dVar198 * dVar1;
      dVar208 = dVar186 * dVar88;
      auVar146._8_8_ = dVar152;
      auVar146._0_8_ = 0x3ff0000000000000;
      auVar166._8_8_ = dVar28;
      auVar166._0_8_ = dVar28 * dVar232;
      auVar197._8_8_ = dVar152;
      auVar197._0_8_ = 0x3ff0000000000000;
      auVar197 = divpd(auVar197,auVar166);
      dVar95 = 1.0 / dVar28;
      dVar96 = 1.0 / dVar60;
      dVar29 = dVar28 * dVar60;
      auVar114._0_8_ = dVar60 * dVar232;
      auVar114._8_8_ = dVar60;
      auVar165._8_8_ = dVar152;
      auVar165._0_8_ = 0x3ff0000000000000;
      auVar166 = divpd(auVar165,auVar114);
      dVar61 = 1.0 / dVar29;
      auVar147._0_8_ = dVar232 * dVar29;
      auVar147._8_8_ = dVar29;
      auVar147 = divpd(auVar146,auVar147);
      dVar97 = dVar155 * 0.9847450218426964;
      dVar62 = dVar198 * dVar168;
      dVar29 = pdVar3[6];
      dVar63 = dVar62 * dVar29;
      dVar60 = pdVar3[1];
      dVar30 = dVar60 * dVar209;
      dVar31 = 1.0 / dVar232;
      dVar210 = dVar209 * dVar198;
      dVar89 = pdVar3[3];
      dVar32 = dVar89 * dVar210;
      dVar33 = dVar168 * dVar210;
      dVar91 = pdVar3[10];
      dVar64 = dVar198 * dVar148 * dVar91;
      dVar85 = pdVar3[0xb];
      dVar215 = dVar148 * dVar85 * dVar210;
      dVar231 = auVar197._8_8_;
      dVar220 = auVar166._8_8_;
      dVar203 = auVar147._8_8_;
      dVar34 = dVar97 * -0.375;
      dVar35 = -dVar134;
      uVar17 = -(ulong)(dVar54 <= dVar22);
      if (dVar22 < dVar150) {
        local_e98 = (double)(~uVar17 & (ulong)(dVar92 * dVar35) | (ulong)-local_e98 & uVar17);
      }
      dVar42 = *pdVar3;
      dVar86 = pdVar3[7];
      dVar87 = pdVar3[8];
      local_e98 = local_e98 + 1.0;
      dVar36 = cbrt(local_e98);
      uVar18 = -(ulong)(local_e98 <= dVar22);
      dVar163 = (double)((ulong)(dVar23 * dVar22) & uVar18 | ~uVar18 & (ulong)(local_e98 * dVar36));
      dVar37 = dVar163 * 0.9847450218426964;
      dVar65 = local_f50 * local_f50;
      dVar38 = cbrt(local_f50);
      dVar98 = 1.0 / (dVar38 * dVar38);
      dVar39 = dVar98 / dVar65;
      dVar66 = dVar57 * 0.009146457198521547 * local_f28 * dVar39 + 0.804;
      dVar67 = 1.804 - 0.646416 / dVar66;
      dVar99 = dVar98 / local_f50;
      dVar169 = dVar167 - local_e18 * dVar99;
      dVar167 = local_e18 * dVar99 + dVar167;
      dVar23 = pdVar3[4];
      dVar90 = pdVar3[5];
      dVar137 = dVar23 * dVar168;
      dVar149 = dVar86 * dVar33;
      dVar117 = dVar90 * dVar136;
      dVar133 = dVar87 * dVar148;
      local_b78 = auVar197._0_8_;
      local_978 = auVar166._0_8_;
      local_968 = auVar147._0_8_;
      dVar100 = dVar149 * local_968 +
                dVar63 * local_978 +
                dVar117 * local_b78 +
                dVar137 * dVar31 +
                dVar32 * dVar61 +
                dVar204 * dVar96 +
                dVar30 * dVar95 +
                dVar215 * dVar203 + dVar64 * dVar220 + dVar133 * dVar152 + dVar231 * dVar208 +
                dVar42;
      dVar68 = dVar94 * dVar100;
      dVar101 = dVar55 * dVar68;
      uVar19 = -(ulong)(dVar21 <= dVar132);
      dVar118 = dVar167 * dVar167;
      dVar69 = dVar118 * dVar118;
      dVar187 = 1.0 / (dVar69 * dVar69);
      dVar240 = 1.0 / dVar118;
      dVar138 = dVar167 * dVar118;
      dVar205 = dVar187 / dVar118;
      dVar211 = 1.0 / (dVar118 * dVar69);
      dVar199 = 1.0 / (dVar69 * dVar138);
      dVar233 = 1.0 / dVar138;
      dVar138 = dVar187 / dVar138;
      dVar235 = 1.0 / dVar167;
      dVar139 = dVar60 * dVar169;
      dVar216 = dVar169 * dVar169;
      dVar119 = dVar1 * dVar216;
      dVar236 = dVar169 * dVar216;
      dVar120 = dVar89 * dVar236;
      dVar221 = 1.0 / dVar69;
      dVar170 = dVar216 * dVar216;
      dVar140 = dVar169 * dVar170;
      dVar241 = dVar170 * dVar23;
      dVar244 = dVar140 * dVar90;
      dVar222 = dVar187 / dVar167;
      dVar121 = 1.0 / (dVar167 * dVar69);
      dVar141 = dVar216 * dVar170;
      dVar122 = dVar29 * dVar141;
      dVar142 = dVar170 * dVar236;
      dVar118 = dVar86 * dVar142;
      dVar171 = dVar170 * dVar170;
      dVar123 = dVar87 * dVar171;
      dVar102 = dVar169 * dVar171;
      dVar40 = dVar88 * dVar102;
      dVar124 = dVar91 * dVar216 * dVar171;
      dVar41 = dVar85 * dVar171 * dVar236;
      dVar42 = dVar41 * dVar138 +
               dVar124 * dVar205 +
               dVar40 * dVar222 +
               dVar123 * dVar187 +
               dVar118 * dVar199 +
               dVar122 * dVar211 +
               dVar244 * dVar121 +
               dVar241 * dVar221 + dVar120 * dVar233 + dVar139 * dVar235 + dVar119 * dVar240 +
               dVar42;
      dVar125 = dVar67 * dVar42;
      dVar143 = dVar55 * dVar125;
      dVar43 = dVar37 * -0.375;
      uVar20 = -(ulong)(local_f50 <= dVar132);
      dVar234 = (double)(~uVar20 & (ulong)(dVar43 * dVar143)) +
                (double)(~uVar19 & (ulong)(dVar34 * dVar101));
      pdVar4 = out->zk;
      if ((uVar2 & 1) != 0 && pdVar4 != (double *)0x0) {
        lVar6 = (long)(p->dim).zk * sVar10;
        pdVar4[lVar6] = pdVar4[lVar6] + dVar234;
      }
      dVar44 = 1.0 / (__x * __x);
      bVar13 = dVar22 < dVar150;
      bVar14 = dVar22 < dVar54;
      local_5a8 = 0.0;
      dVar103 = 0.0;
      if (bVar14 && bVar13) {
        dVar103 = dVar92 - dVar134 * dVar44;
      }
      dVar45 = dVar24 * 1.3333333333333333;
      dVar70 = (double)(~uVar16 & (ulong)(dVar45 * dVar103));
      dVar217 = 1.0 / (dVar25 * dVar25);
      dVar71 = 1.0 / (dVar135 * dVar135);
      dVar153 = dVar1 * dVar209;
      dVar172 = dVar148 * dVar88;
      dVar188 = dVar186 * dVar91;
      dVar237 = dVar152 / dVar232;
      dVar144 = local_a88 * dVar96;
      dVar25 = dVar59 * local_a88 * dVar61;
      dVar154 = dVar89 * dVar198;
      dVar126 = dVar59 * local_a88 * dVar31;
      dVar46 = dVar23 * dVar210;
      dVar173 = dVar59 * local_a88 * local_b78;
      dVar189 = dVar90 * dVar168;
      dVar47 = dVar59 * local_a88 * local_978;
      dVar104 = dVar136 * dVar29;
      dVar116 = dVar33 * dVar87;
      dVar127 = dVar59 * local_a88 * local_968;
      dVar174 = dVar62 * dVar86;
      dVar175 = dVar59 * local_a88 * dVar152;
      dVar176 = dVar59 * local_a88 * dVar231;
      dVar177 = dVar59 * local_a88 * dVar220;
      dVar178 = dVar59 * local_a88 * dVar203;
      dVar128 = dVar198 * dVar148 * dVar85;
      dVar190 = local_a88 * dVar237 * dVar215 * 18.333333333333332 * dVar59 +
                dVar178 * dVar128 * 18.333333333333332 +
                dVar64 * 16.666666666666668 * dVar178 +
                dVar188 * 16.666666666666668 * dVar177 +
                dVar208 * 15.0 * dVar177 +
                dVar172 * 15.0 * dVar176 +
                dVar133 * 13.333333333333334 * dVar176 +
                dVar116 * 13.333333333333334 * dVar175 +
                dVar149 * 11.666666666666666 * dVar175 +
                dVar127 * dVar63 * 10.0 + dVar174 * 11.666666666666666 * dVar127 +
                dVar47 * dVar104 * 10.0 +
                dVar117 * 8.333333333333334 * dVar47 +
                dVar173 * dVar189 * 8.333333333333334 +
                dVar137 * 6.666666666666667 * dVar173 +
                dVar126 * dVar46 * 6.666666666666667 +
                dVar32 * 5.0 * dVar126 +
                dVar25 * dVar154 * 5.0 +
                dVar204 * 3.3333333333333335 * dVar25 +
                dVar59 * dVar144 * dVar153 * 3.3333333333333335 +
                local_a88 * dVar60 * 1.6666666666666667 * dVar59 * dVar95 +
                dVar30 * 1.6666666666666667 * dVar59 * dVar144;
      dVar25 = dVar70 * 0.9847450218426964;
      dVar178 = pdVar3[0xc] * dVar217;
      dVar47 = dVar68 * dVar178;
      dVar200 = dVar97 * dVar47 * 0.125;
      dVar155 = dVar155 * 1.4422495703074083;
      dVar126 = dVar55 * dVar71;
      dVar156 = dVar155 * dVar126;
      dVar173 = dVar21 * dVar93;
      dVar127 = dVar58 / dVar173;
      dVar175 = local_f10 * dVar127 * dVar57;
      dVar176 = dVar175 * dVar100;
      dVar177 = dVar55 * dVar94 * dVar190;
      if (dVar132 < dVar21) {
        local_5a8 = dVar34 * dVar177 +
                    dVar156 * 0.0040369036088841095 * dVar176 +
                    (dVar25 * -0.375 * dVar101 - dVar200);
      }
      dVar157 = 0.0;
      if (dVar22 < dVar150) {
        dVar157 = (double)(~uVar17 & (ulong)(-dVar92 - dVar44 * dVar35));
      }
      dVar201 = dVar36 * 1.3333333333333333;
      dVar158 = (double)(~uVar18 & (ulong)(dVar201 * dVar157));
      dVar150 = dVar158 * 0.9847450218426964;
      dVar191 = dVar125 * dVar178;
      dVar192 = dVar150 * -0.375;
      dVar129 = dVar37 * dVar191 * -0.125;
      dVar212 = (double)(~uVar20 & (ulong)(dVar192 * dVar143 + dVar129));
      pdVar4 = out->vrho;
      bVar11 = (uVar2 & 2) != 0;
      if (bVar11 && pdVar4 != (double *)0x0) {
        lVar6 = (long)(p->dim).vrho * sVar10;
        pdVar4[lVar6] = __x * (local_5a8 + dVar212) + dVar234 + pdVar4[lVar6];
      }
      dVar72 = 0.0;
      local_688 = 0.0;
      if (dVar22 < dVar54) {
        dVar72 = (double)(~uVar15 & (ulong)(-dVar92 - dVar134 * dVar44));
      }
      dVar54 = 0.0;
      if (bVar14 && bVar13) {
        dVar54 = dVar92 - dVar44 * dVar35;
      }
      dVar223 = (double)(~uVar16 & (ulong)(dVar45 * dVar72));
      dVar145 = (double)(~uVar18 & (ulong)(dVar54 * dVar201));
      dVar218 = 1.0 / (dVar66 * dVar66);
      dVar105 = local_e18 * dVar240;
      dVar159 = dVar1 * dVar169;
      dVar179 = dVar39 * local_e18 * dVar233;
      dVar238 = dVar89 * dVar216;
      dVar106 = dVar39 * local_e18 * dVar221;
      dVar160 = dVar23 * dVar236;
      dVar180 = dVar39 * local_e18 * dVar121;
      dVar107 = dVar90 * dVar170;
      dVar108 = dVar39 * local_e18 * dVar211;
      dVar161 = dVar29 * dVar140;
      dVar162 = dVar187 / dVar69;
      dVar92 = dVar39 * local_e18 * dVar199;
      dVar193 = dVar86 * dVar141;
      dVar181 = dVar39 * local_e18 * dVar187;
      dVar73 = dVar87 * dVar142;
      dVar74 = dVar39 * local_e18 * dVar222;
      dVar182 = dVar88 * dVar171;
      dVar183 = dVar39 * local_e18 * dVar205;
      dVar75 = dVar91 * dVar102;
      dVar76 = dVar39 * local_e18 * dVar138;
      dVar242 = dVar216 * dVar171 * dVar85;
      dVar183 = dVar41 * 18.333333333333332 * local_e18 * dVar162 * dVar39 +
                dVar76 * dVar242 * 18.333333333333332 +
                dVar124 * 16.666666666666668 * dVar76 +
                dVar183 * dVar75 * 16.666666666666668 +
                dVar40 * 15.0 * dVar183 +
                dVar74 * dVar182 * 15.0 +
                dVar123 * 13.333333333333334 * dVar74 +
                dVar181 * dVar73 * 13.333333333333334 +
                dVar118 * 11.666666666666666 * dVar181 +
                dVar92 * dVar122 * 10.0 + dVar193 * 11.666666666666666 * dVar92 +
                dVar108 * dVar161 * 10.0 +
                dVar244 * 8.333333333333334 * dVar108 +
                dVar180 * dVar107 * 8.333333333333334 +
                dVar241 * 6.666666666666667 * dVar180 +
                dVar106 * dVar160 * 6.666666666666667 +
                dVar120 * 5.0 * dVar106 +
                dVar179 * dVar238 * 5.0 +
                dVar119 * 3.3333333333333335 * dVar179 +
                dVar39 * dVar105 * dVar159 * 3.3333333333333335 +
                local_e18 * dVar60 * 1.6666666666666667 * dVar39 * dVar235 +
                dVar139 * 1.6666666666666667 * dVar39 * dVar105;
      dVar181 = dVar223 * 0.9847450218426964;
      dVar224 = dVar181 * -0.375;
      dVar180 = dVar145 * 0.9847450218426964;
      dVar163 = dVar163 * 1.4422495703074083;
      dVar108 = dVar55 * dVar218;
      dVar92 = dVar163 * dVar108;
      dVar74 = local_f50 * dVar65;
      dVar179 = dVar98 / dVar74;
      dVar76 = local_f28 * dVar179 * dVar57;
      dVar206 = dVar76 * dVar42;
      dVar106 = dVar55 * dVar67 * dVar183;
      if (dVar132 < local_f50) {
        local_688 = dVar43 * dVar106 +
                    dVar92 * 0.0040369036088841095 * dVar206 + dVar180 * -0.375 * dVar143 + dVar129;
      }
      dVar200 = (double)(~uVar19 & (ulong)(dVar224 * dVar101 - dVar200));
      if (bVar11 && pdVar4 != (double *)0x0) {
        lVar6 = (long)(p->dim).vrho * sVar10;
        pdVar4[lVar6 + 1] = (dVar200 + local_688) * __x + dVar234 + pdVar4[lVar6 + 1];
      }
      bVar11 = (uVar2 & 2) != 0;
      dVar77 = dVar55 * dVar155;
      dVar234 = dVar56 * dVar59 * dVar71 * 1.8171205928321397;
      dVar130 = dVar234 * dVar100;
      dVar129 = dVar77 * -0.0015138388533315413;
      dVar131 = (double)(~uVar19 & (ulong)(dVar129 * dVar130));
      pdVar4 = out->vsigma;
      if (pdVar4 != (double *)0x0 && bVar11) {
        lVar6 = (long)(p->dim).vsigma * sVar10;
        dVar48 = (pdVar4 + lVar6)[1];
        pdVar4[lVar6] = __x * dVar131 + pdVar4[lVar6];
        (pdVar4 + lVar6)[1] = dVar48 + 0.0;
      }
      dVar184 = dVar55 * dVar163;
      dVar48 = dVar56 * dVar39 * dVar218 * 1.8171205928321397;
      dVar78 = dVar48 * dVar42;
      dVar49 = dVar184 * -0.0015138388533315413;
      dVar79 = (double)(~uVar20 & (ulong)(dVar49 * dVar78));
      if (pdVar4 != (double *)0x0 && bVar11) {
        lVar6 = (long)(p->dim).vsigma * sVar10;
        pdVar4[lVar6 + 2] = __x * dVar79 + pdVar4[lVar6 + 2];
      }
      pdVar4 = out->vlapl;
      uVar5 = ~uVar2;
      if ((uVar5 & 0x8002) == 0 && pdVar4 != (double *)0x0) {
        lVar6 = (long)(p->dim).vlapl * sVar10;
        dVar80 = (pdVar4 + lVar6)[1];
        pdVar4[lVar6] = pdVar4[lVar6] + 0.0;
        (pdVar4 + lVar6)[1] = dVar80 + 0.0;
      }
      dVar109 = dVar133 * -8.0 * dVar151 * dVar231 +
                dVar149 * -7.0 * dVar151 * dVar152 +
                dVar63 * -6.0 * dVar151 * local_968 +
                dVar128 * -11.0 * dVar151 * dVar203 +
                dVar188 * -10.0 * dVar151 * dVar220 +
                dVar172 * -9.0 * dVar151 * dVar231 +
                dVar116 * -8.0 * dVar151 * dVar152 +
                dVar174 * -7.0 * dVar151 * local_968 +
                dVar64 * -10.0 * dVar151 * dVar203 +
                dVar215 * -11.0 * dVar237 * dVar151 + dVar208 * -9.0 * dVar151 * dVar220 +
                dVar117 * -5.0 * dVar151 * local_978 +
                dVar137 * -4.0 * dVar151 * local_b78 +
                dVar32 * -3.0 * dVar151 * dVar31 +
                dVar204 * -2.0 * dVar151 * dVar61 +
                ((dVar104 * -6.0 * dVar151 * local_978 +
                 dVar189 * -5.0 * dVar151 * local_b78 +
                 dVar46 * -4.0 * dVar151 * dVar31 +
                 dVar154 * -3.0 * dVar151 * dVar61 +
                 (dVar153 * -2.0 * dVar151 * dVar96 - dVar151 * dVar60 * dVar95)) -
                dVar151 * dVar96 * dVar30);
      dVar151 = dVar55 * dVar94 * dVar109;
      dVar80 = (double)(~uVar19 & (ulong)(dVar34 * dVar151));
      pdVar4 = out->vtau;
      bVar11 = (uVar5 & 0x10002) == 0;
      if (bVar11 && pdVar4 != (double *)0x0) {
        lVar6 = (long)(p->dim).vtau * sVar10;
        pdVar4[lVar6] = __x * dVar80 + pdVar4[lVar6];
      }
      dVar81 = dVar242 * -11.0 * dVar99 * dVar138 +
               dVar75 * -10.0 * dVar99 * dVar205 +
               dVar182 * -9.0 * dVar99 * dVar222 +
               dVar73 * -8.0 * dVar99 * dVar187 +
               dVar193 * -7.0 * dVar99 * dVar199 +
               dVar124 * -10.0 * dVar99 * dVar138 +
               dVar40 * -9.0 * dVar99 * dVar205 +
               dVar123 * -8.0 * dVar99 * dVar222 +
               dVar118 * -7.0 * dVar99 * dVar187 +
               dVar41 * -11.0 * dVar162 * dVar99 + dVar122 * -6.0 * dVar99 * dVar199 +
               dVar161 * -6.0 * dVar99 * dVar211 +
               dVar107 * -5.0 * dVar99 * dVar121 +
               dVar160 * -4.0 * dVar99 * dVar221 +
               dVar238 * -3.0 * dVar99 * dVar233 +
               dVar159 * -2.0 * dVar99 * dVar240 +
               dVar244 * -5.0 * dVar99 * dVar211 +
               dVar241 * -4.0 * dVar99 * dVar121 +
               dVar120 * -3.0 * dVar99 * dVar221 +
               dVar119 * -2.0 * dVar99 * dVar233 +
               (-dVar60 * dVar99 * dVar235 - dVar99 * dVar240 * dVar139);
      dVar99 = dVar67 * dVar81;
      dVar82 = dVar55 * dVar99;
      dVar83 = (double)(~uVar20 & (ulong)(dVar43 * dVar82));
      if (bVar11 && pdVar4 != (double *)0x0) {
        lVar6 = (long)(p->dim).vtau * sVar10;
        pdVar4[lVar6 + 1] = __x * dVar83 + pdVar4[lVar6 + 1];
      }
      dVar24 = 1.0 / (dVar24 * dVar24);
      dVar225 = 1.0 / (__x * __x * __x);
      dVar134 = dVar134 * dVar225;
      dVar134 = dVar134 + dVar134;
      dVar202 = -0.0;
      if (dVar22 < dVar53) {
        dVar202 = 0.0;
        if (bVar14 && bVar13) {
          dVar202 = dVar134 - (dVar44 + dVar44);
        }
        dVar202 = (dVar202 * dVar45 + dVar24 * 0.4444444444444444 * dVar103 * dVar103) *
                  0.9847450218426964 * -0.375;
      }
      dVar70 = dVar70 * 1.4422495703074083;
      dVar217 = (dVar217 / __x) * pdVar3[0xc];
      dVar68 = (dVar68 * dVar217 * dVar97) / 12.0;
      dVar243 = dVar71 * dVar178 * dVar155 * dVar176;
      auVar115._0_8_ = 1.0 / dVar26;
      auVar115._8_8_ = dVar71;
      auVar52._8_8_ = dVar135;
      auVar52._0_8_ = 0x4023bd3cc9be45de;
      auVar147 = divpd(auVar115,auVar52);
      dVar135 = auVar147._0_8_;
      dVar164 = auVar147._8_8_ * dVar55 * dVar155;
      dVar110 = dVar135 * 3.3019272488946267;
      dVar26 = 1.0 / (dVar36 * dVar36);
      dVar225 = dVar225 * dVar35;
      dVar225 = dVar225 + dVar225;
      dVar35 = -0.0;
      if (dVar22 < local_e98) {
        dVar35 = 0.0;
        if (bVar14 && bVar13) {
          dVar35 = dVar44 + dVar44 + dVar225;
        }
        dVar35 = (dVar35 * dVar201 + dVar26 * 0.4444444444444444 * dVar157 * dVar157) *
                 0.9847450218426964 * -0.375;
      }
      dVar111 = dVar93 * dVar93;
      dVar27 = 1.0 / dVar27;
      dVar36 = dVar27 / (dVar21 * dVar111);
      dVar28 = dVar152 / (dVar28 * dVar232);
      dVar232 = dVar94 * dVar190 * dVar178 * dVar97;
      dVar209 = dVar209 * dVar89;
      dVar198 = dVar198 * dVar23;
      dVar210 = dVar210 * dVar90;
      dVar168 = dVar168 * dVar29;
      dVar148 = dVar148 * dVar91;
      dVar186 = dVar186 * dVar85;
      dVar62 = dVar62 * dVar87;
      dVar33 = dVar33 * dVar88;
      dVar136 = dVar136 * dVar86;
      dVar150 = dVar150 * dVar191;
      dVar125 = (dVar125 * dVar217 * dVar37) / 12.0;
      pdVar3 = out->v2rho2;
      bVar11 = pdVar3 != (double *)0x0;
      bVar12 = (uVar2 & 4) != 0;
      if (bVar12 && bVar11) {
        dVar185 = local_a88 * local_a88;
        dVar217 = local_a88 * dVar61 * dVar127;
        dVar50 = local_a88 * dVar31 * dVar127;
        dVar194 = local_a88 * dVar203 * dVar127;
        dVar195 = local_a88 * local_b78 * dVar127;
        dVar196 = local_a88 * local_978 * dVar127;
        dVar226 = local_a88 * local_968 * dVar127;
        dVar227 = local_a88 * dVar152 * dVar127;
        dVar228 = local_a88 * dVar231 * dVar127;
        dVar229 = local_a88 * dVar220 * dVar127;
        dVar213 = dVar185 * dVar61 * dVar36;
        dVar207 = dVar185 * dVar31 * dVar36;
        dVar112 = dVar185 * local_b78 * dVar36;
        dVar239 = dVar185 * local_978 * dVar36;
        dVar51 = dVar185 * local_968 * dVar36;
        dVar219 = dVar185 * dVar152 * dVar36;
        dVar214 = dVar185 * dVar220 * dVar36;
        dVar113 = dVar185 * dVar203 * dVar36;
        dVar230 = dVar185 * dVar237 * dVar36;
        dVar84 = dVar185 * dVar231 * dVar36;
        lVar6 = (long)(p->dim).v2rho2 * sVar10;
        pdVar3[lVar6] =
             ((double)(~uVar20 & (ulong)(dVar35 * dVar143 + dVar150 * -0.25 + dVar125)) +
             (double)(~uVar19 &
                     (ulong)((dVar149 * 155.55555555555554 * dVar84 +
                              dVar174 * 272.22222222222223 * dVar219 +
                              dVar136 * 116.66666666666667 * dVar51 +
                              dVar185 * dVar28 * dVar215 * 366.6666666666667 * dVar36 +
                              dVar33 * 200.0 * dVar84 +
                              dVar133 * 200.0 * dVar214 +
                              dVar116 * 355.55555555555554 * dVar84 +
                              dVar62 * 155.55555555555554 * dVar219 +
                              dVar204 * 16.666666666666668 * dVar207 +
                              dVar128 * 672.2222222222222 * dVar230 +
                              dVar186 * 305.55555555555554 * dVar113 +
                              dVar64 * 305.55555555555554 * dVar230 +
                              dVar148 * 250.0 * dVar214 + dVar188 * 555.5555555555555 * dVar113 +
                             dVar208 * 250.0 * dVar113 +
                             dVar172 * 450.0 * dVar214 +
                             dVar153 * 22.22222222222222 * dVar213 +
                             dVar30 * 5.555555555555555 * dVar213 +
                             dVar63 * 116.66666666666667 * dVar219 +
                             dVar104 * 200.0 * dVar51 +
                             dVar168 * 83.33333333333333 * dVar239 +
                             dVar117 * 83.33333333333333 * dVar51 +
                             dVar189 * 138.88888888888889 * dVar239 +
                             dVar210 * 55.55555555555556 * dVar112 +
                             dVar137 * 55.55555555555556 * dVar239 +
                             dVar198 * 33.333333333333336 * dVar207 +
                             dVar46 * 88.88888888888889 * dVar112 +
                             dVar32 * 33.333333333333336 * dVar112 +
                             dVar154 * 50.0 * dVar207 +
                             dVar209 * 16.666666666666668 * dVar213 +
                             dVar30 * -4.444444444444445 * dVar127 * dVar144 +
                             dVar188 * -44.44444444444444 * dVar229 +
                             dVar208 * -40.0 * dVar229 +
                             dVar172 * -40.0 * dVar228 +
                             dVar133 * -35.55555555555556 * dVar228 +
                             dVar116 * -35.55555555555556 * dVar227 +
                             dVar149 * -31.11111111111111 * dVar227 +
                             dVar174 * -31.11111111111111 * dVar226 +
                             dVar63 * -26.666666666666668 * dVar226 +
                             dVar117 * -22.22222222222222 * dVar196 +
                             dVar104 * -26.666666666666668 * dVar196 +
                             dVar189 * -22.22222222222222 * dVar195 +
                             dVar137 * -17.77777777777778 * dVar195 +
                             dVar46 * -17.77777777777778 * dVar50 +
                             local_a88 * dVar237 * dVar215 * -48.888888888888886 * dVar127 +
                             dVar128 * -48.888888888888886 * dVar194 +
                             dVar64 * -44.44444444444444 * dVar194 +
                             dVar32 * -13.333333333333334 * dVar50 +
                             dVar154 * -13.333333333333334 * dVar217 +
                             dVar204 * -8.88888888888889 * dVar217 +
                             dVar153 * -8.88888888888889 * dVar127 * dVar144 +
                             local_a88 * dVar60 * -4.444444444444445 * dVar127 * dVar95 +
                             dVar185 * dVar60 * 5.555555555555555 * dVar36 * dVar96 +
                             dVar185 * dVar1 * 5.555555555555555 * dVar36 * dVar96) * dVar94 *
                             dVar55 * dVar34 +
                            dVar156 * 0.008073807217768219 * dVar175 * dVar190 +
                            dVar232 * -0.25 +
                            dVar243 * 0.0026912690725894063 +
                            dVar25 * -0.75 * dVar177 +
                            dVar70 * dVar126 * 0.008073807217768219 * dVar176 +
                            dVar202 * dVar101 + dVar25 * dVar47 * -0.25 + dVar68 +
                            dVar164 * 0.00019692461905715026 *
                            (dVar27 / (dVar111 * dVar173)) * local_f10 * local_f10 * dVar110 *
                            dVar100 + dVar156 * -0.014801979899241736 *
                                      (dVar58 / dVar111) * local_f10 * dVar57 * dVar100))) * __x +
             local_5a8 + local_5a8 + dVar212 + dVar212 + pdVar3[lVar6];
      }
      dVar35 = -0.0;
      if (dVar22 < dVar53) {
        dVar35 = 0.0;
        if (bVar14 && bVar13) {
          dVar35 = dVar134;
        }
        dVar35 = (dVar24 * dVar72 * 0.4444444444444444 * dVar103 + dVar35 * dVar45) *
                 0.9847450218426964 * -0.375;
      }
      dVar181 = dVar47 * dVar181;
      dVar223 = dVar223 * 1.4422495703074083;
      dVar58 = 0.0;
      if (dVar132 < dVar21) {
        dVar58 = dVar232 * -0.125 +
                 dVar243 * 0.0013456345362947032 +
                 dVar25 * dVar47 * -0.125 +
                 dVar177 * dVar224 +
                 dVar126 * dVar223 * 0.0040369036088841095 * dVar176 +
                 dVar35 * dVar101 + dVar181 * -0.125 + dVar68;
      }
      dVar35 = -0.0;
      if (dVar22 < local_e98) {
        dVar35 = 0.0;
        if (bVar14 && bVar13) {
          dVar35 = dVar225;
        }
        dVar35 = (dVar54 * dVar26 * 0.4444444444444444 * dVar157 + dVar35 * dVar201) *
                 0.9847450218426964 * -0.375;
      }
      dVar158 = dVar158 * 1.4422495703074083;
      dVar232 = dVar218 * dVar178 * dVar163 * dVar206;
      dVar47 = dVar67 * dVar183 * dVar178 * dVar37;
      dVar103 = 0.0;
      if (dVar132 < local_f50) {
        dVar103 = dVar47 * -0.125 +
                  dVar192 * dVar106 +
                  dVar232 * 0.0013456345362947032 +
                  dVar108 * dVar158 * 0.0040369036088841095 * dVar206 +
                  dVar150 * -0.125 + dVar35 * dVar143 + dVar191 * dVar180 * -0.125 + dVar125;
      }
      if (bVar12 && bVar11) {
        lVar6 = (long)(p->dim).v2rho2 * sVar10;
        pdVar3[lVar6 + 1] =
             (dVar58 + dVar103) * __x + local_5a8 + dVar212 + dVar200 + local_688 +
             pdVar3[lVar6 + 1];
      }
      dVar150 = -0.0;
      if (dVar22 < dVar53) {
        dVar53 = 0.0;
        if (bVar14 && bVar13) {
          dVar53 = dVar44 + dVar44 + dVar134;
        }
        dVar150 = (dVar45 * dVar53 + dVar24 * 0.4444444444444444 * dVar72 * dVar72) *
                  0.9847450218426964 * -0.375;
      }
      dVar53 = -0.0;
      if (dVar22 < local_e98) {
        dVar22 = 0.0;
        if (bVar14 && bVar13) {
          dVar22 = dVar225 - (dVar44 + dVar44);
        }
        dVar53 = (dVar22 * dVar201 + dVar26 * 0.4444444444444444 * dVar54 * dVar54) *
                 0.9847450218426964 * -0.375;
      }
      dVar134 = dVar65 * dVar65;
      dVar38 = 1.0 / dVar38;
      dVar54 = dVar38 / (local_f50 * dVar134);
      dVar85 = dVar85 * dVar102;
      dVar22 = dVar187 / (dVar167 * dVar69);
      dVar29 = dVar29 * dVar170;
      dVar86 = dVar86 * dVar140;
      dVar87 = dVar87 * dVar141;
      dVar88 = dVar88 * dVar142;
      dVar89 = dVar89 * dVar169;
      dVar23 = dVar23 * dVar216;
      dVar90 = dVar90 * dVar236;
      dVar145 = dVar145 * 1.4422495703074083;
      dVar91 = dVar91 * dVar171;
      dVar24 = dVar55 * (dVar218 / dVar66) * dVar163;
      if (bVar12 && bVar11) {
        dVar176 = local_e18 * local_e18;
        dVar170 = dVar176 * dVar205 * dVar54;
        dVar141 = dVar176 * dVar222 * dVar54;
        dVar142 = local_e18 * dVar222 * dVar179;
        dVar103 = dVar176 * dVar121 * dVar54;
        dVar236 = local_e18 * dVar121 * dVar179;
        dVar44 = dVar176 * dVar211 * dVar54;
        dVar26 = local_e18 * dVar233 * dVar179;
        dVar35 = local_e18 * dVar205 * dVar179;
        dVar169 = local_e18 * dVar138 * dVar179;
        dVar177 = dVar176 * dVar138 * dVar54;
        dVar167 = local_e18 * dVar221 * dVar179;
        dVar69 = dVar176 * dVar162 * dVar54;
        dVar140 = dVar176 * dVar233 * dVar54;
        dVar102 = dVar176 * dVar221 * dVar54;
        dVar45 = local_e18 * dVar187 * dVar179;
        dVar126 = dVar176 * dVar187 * dVar54;
        dVar171 = local_e18 * dVar199 * dVar179;
        dVar216 = dVar176 * dVar199 * dVar54;
        dVar58 = local_e18 * dVar211 * dVar179;
        lVar6 = (long)(p->dim).v2rho2 * sVar10;
        pdVar3[lVar6 + 2] =
             ((double)(~uVar20 &
                      (ulong)((dVar141 * dVar118 * 155.55555555555554 +
                               dVar126 * dVar193 * 272.22222222222223 +
                               dVar86 * 116.66666666666667 * dVar216 +
                               dVar126 * dVar122 * 116.66666666666667 +
                               dVar216 * dVar161 * 200.0 +
                               dVar44 * dVar29 * 83.33333333333333 +
                               dVar216 * dVar244 * 83.33333333333333 +
                               dVar54 * dVar41 * 366.6666666666667 * dVar176 * dVar22 +
                               dVar242 * 672.2222222222222 * dVar69 +
                               dVar85 * 305.55555555555554 * dVar177 +
                               dVar179 * dVar105 * dVar159 * -8.88888888888889 +
                               dVar123 * -35.55555555555556 * dVar142 +
                               dVar139 * -4.444444444444445 * dVar179 * dVar105 +
                               dVar87 * 155.55555555555554 * dVar126 +
                               dVar45 * dVar118 * -31.11111111111111 +
                               dVar171 * dVar193 * -31.11111111111111 +
                               dVar122 * -26.666666666666668 * dVar171 +
                               dVar58 * dVar161 * -26.666666666666668 +
                               dVar58 * dVar244 * -22.22222222222222 +
                               dVar236 * dVar107 * -22.22222222222222 +
                               dVar236 * dVar241 * -17.77777777777778 +
                               dVar167 * dVar160 * -17.77777777777778 +
                               dVar120 * -13.333333333333334 * dVar167 +
                               dVar176 * dVar1 * 5.555555555555555 * dVar240 * dVar54 +
                               dVar235 * local_e18 * dVar60 * -4.444444444444445 * dVar179 +
                               dVar176 * dVar60 * 5.555555555555555 * dVar240 * dVar54 +
                               dVar73 * -35.55555555555556 * dVar45 +
                               dVar160 * 88.88888888888889 * dVar103 +
                               dVar102 * dVar23 * 33.333333333333336 +
                               dVar120 * 33.333333333333336 * dVar103 +
                               dVar238 * 50.0 * dVar102 +
                               dVar140 * dVar89 * 16.666666666666668 +
                               dVar119 * 16.666666666666668 * dVar102 +
                               dVar159 * 22.22222222222222 * dVar140 +
                               dVar139 * 5.555555555555555 * dVar140 +
                               dVar177 * dVar40 * 250.0 +
                               dVar182 * 450.0 * dVar170 +
                               dVar88 * 200.0 * dVar141 +
                               dVar73 * 355.55555555555554 * dVar141 + dVar123 * 200.0 * dVar170 +
                              dVar69 * dVar124 * 305.55555555555554 +
                              dVar75 * 555.5555555555555 * dVar177 +
                              dVar170 * dVar91 * 250.0 +
                              dVar41 * -48.888888888888886 * local_e18 * dVar162 * dVar179 +
                              dVar169 * dVar242 * -48.888888888888886 +
                              dVar124 * -44.44444444444444 * dVar169 +
                              dVar35 * dVar75 * -44.44444444444444 +
                              dVar40 * -40.0 * dVar35 +
                              dVar142 * dVar182 * -40.0 +
                              dVar26 * dVar238 * -13.333333333333334 +
                              dVar119 * -8.88888888888889 * dVar26 +
                              dVar44 * dVar107 * 138.88888888888889 +
                              dVar241 * 55.55555555555556 * dVar44 +
                              dVar90 * 55.55555555555556 * dVar103) * dVar67 * dVar55 * dVar43 +
                             dVar47 * -0.25 +
                             dVar232 * 0.0026912690725894063 +
                             dVar125 + dVar180 * -0.75 * dVar106 +
                                       dVar108 * dVar145 * 0.008073807217768219 * dVar206 +
                                       dVar53 * dVar143 + dVar191 * dVar180 * -0.25 +
                             local_f28 * local_f28 * (dVar38 / (dVar134 * dVar74)) * dVar110 *
                             dVar42 * dVar24 * 0.00019692461905715026 +
                             dVar57 * (dVar98 / dVar134) * local_f28 * dVar42 *
                             dVar92 * -0.014801979899241736 +
                             dVar76 * dVar183 * dVar92 * 0.008073807217768219)) +
             (double)(~uVar19 & (ulong)(dVar68 + dVar150 * dVar101 + dVar181 * -0.25))) * __x +
             dVar200 + dVar200 + local_688 + local_688 + pdVar3[lVar6 + 2];
      }
      dVar150 = dVar155 * dVar178 * 0.0005046129511105137 * dVar130;
      dVar53 = 0.0;
      if (dVar132 < dVar21) {
        dVar53 = dVar190 * dVar234 * dVar129 +
                 dVar77 * 0.0040369036088841095 *
                 dVar127 * dVar56 * dVar71 * 1.8171205928321397 * dVar100 +
                 dVar164 * -7.384673214643134e-05 *
                 local_f10 * (dVar27 / (dVar93 * dVar111)) * dVar110 * dVar100 +
                 (dVar70 * dVar55 * -0.0015138388533315413 * dVar130 - dVar150);
      }
      bVar13 = (uVar2 & 4) != 0;
      pdVar3 = out->v2rhosigma;
      bVar14 = pdVar3 != (double *)0x0;
      if (bVar14 && bVar13) {
        lVar6 = (long)(p->dim).v2rhosigma * sVar10;
        dVar26 = (pdVar3 + lVar6)[1];
        pdVar3[lVar6] = dVar53 * __x + dVar131 + pdVar3[lVar6];
        (pdVar3 + lVar6)[1] = dVar26 + 0.0;
      }
      dVar26 = dVar163 * dVar178 * 0.0005046129511105137 * dVar78;
      dVar53 = 0.0;
      if (dVar132 < local_f50) {
        dVar53 = dVar158 * dVar55 * -0.0015138388533315413 * dVar78 - dVar26;
      }
      if (bVar14 && bVar13) {
        lVar6 = (long)(p->dim).v2rhosigma * sVar10;
        pdVar3[lVar6 + 2] = dVar53 * __x + dVar79 + pdVar3[lVar6 + 2];
      }
      dVar53 = 0.0;
      if (dVar132 < dVar21) {
        dVar53 = dVar223 * dVar55 * -0.0015138388533315413 * dVar130 - dVar150;
      }
      if (bVar14 && bVar13) {
        lVar6 = (long)(p->dim).v2rhosigma * sVar10;
        dVar150 = (pdVar3 + lVar6 + 3)[1];
        pdVar3[lVar6 + 3] = dVar53 * __x + dVar131 + pdVar3[lVar6 + 3];
        (pdVar3 + lVar6 + 3)[1] = dVar150 + 0.0;
      }
      dVar53 = 0.0;
      if (dVar132 < local_f50) {
        dVar53 = dVar183 * dVar48 * dVar49 +
                 dVar184 * 0.0040369036088841095 *
                 dVar56 * dVar179 * dVar218 * 1.8171205928321397 * dVar42 +
                 dVar24 * -7.384673214643134e-05 *
                 dVar110 * (dVar38 / (dVar65 * dVar134)) * dVar42 * local_f28 +
                 (dVar145 * dVar55 * -0.0015138388533315413 * dVar78 - dVar26);
      }
      if (bVar14 && bVar13) {
        lVar6 = (long)(p->dim).v2rhosigma * sVar10;
        pdVar3[lVar6 + 5] = dVar53 * __x + dVar79 + pdVar3[lVar6 + 5];
      }
      pdVar3 = out->v2rholapl;
      uVar7 = uVar2 & 0x8004;
      if (uVar7 == 0x8004 && pdVar3 != (double *)0x0) {
        lVar6 = (long)(p->dim).v2rholapl * sVar10;
        dVar53 = (pdVar3 + lVar6)[1];
        dVar150 = pdVar3[lVar6 + 2];
        dVar24 = (pdVar3 + lVar6 + 2)[1];
        pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        (pdVar3 + lVar6)[1] = dVar53 + 0.0;
        pdVar3[lVar6 + 2] = dVar150 + 0.0;
        (pdVar3 + lVar6 + 2)[1] = dVar24 + 0.0;
      }
      dVar53 = dVar97 * dVar94 * dVar109 * dVar178 * 0.125;
      dVar150 = 0.0;
      if (dVar132 < dVar21) {
        dVar111 = dVar27 / dVar111;
        dVar26 = dVar111 * dVar152 * local_a88;
        dVar167 = dVar111 * local_978 * local_a88;
        dVar58 = dVar111 * local_968 * local_a88;
        dVar21 = dVar231 * dVar111 * local_a88;
        dVar56 = dVar111 * dVar61 * local_a88;
        dVar93 = dVar220 * dVar111 * local_a88;
        dVar150 = dVar203 * dVar111 * local_a88;
        dVar24 = dVar111 * dVar237 * local_a88;
        dVar35 = dVar111 * dVar31 * local_a88;
        dVar57 = dVar111 * local_b78 * local_a88;
        dVar150 = (dVar174 * -163.33333333333334 * dVar26 +
                   dVar136 * -70.0 * dVar58 +
                   dVar111 * dVar28 * dVar215 * -220.0 * local_a88 +
                   dVar117 * -50.0 * dVar58 +
                   dVar189 * -83.33333333333333 * dVar167 +
                   dVar57 * dVar210 * -33.333333333333336 +
                   dVar137 * -33.333333333333336 * dVar167 +
                   dVar46 * -53.333333333333336 * dVar57 +
                   dVar35 * dVar198 * -20.0 +
                   dVar32 * -20.0 * dVar57 +
                   dVar154 * -30.0 * dVar35 +
                   dVar209 * -10.0 * dVar56 +
                   dVar153 * -13.333333333333334 * dVar56 + dVar204 * -10.0 * dVar35 +
                  dVar24 * dVar128 * -403.3333333333333 +
                  dVar150 * dVar186 * -183.33333333333334 +
                  dVar64 * -183.33333333333334 * dVar24 +
                  dVar188 * -333.3333333333333 * dVar150 +
                  dVar93 * dVar148 * -150.0 +
                  dVar208 * -150.0 * dVar150 +
                  dVar172 * -270.0 * dVar93 +
                  dVar21 * dVar33 * -120.0 +
                  dVar133 * -120.0 * dVar93 +
                  dVar116 * -213.33333333333334 * dVar21 +
                  dVar62 * -93.33333333333333 * dVar26 +
                  dVar30 * -3.3333333333333335 * dVar56 + dVar149 * -93.33333333333333 * dVar21 +
                  dVar32 * 5.0 * dVar31 * dVar59 +
                  dVar154 * 5.0 * dVar61 * dVar59 +
                  dVar61 * dVar59 * dVar204 * 3.3333333333333335 +
                  dVar128 * 18.333333333333332 * dVar203 * dVar59 +
                  dVar64 * 16.666666666666668 * dVar203 * dVar59 +
                  dVar188 * 16.666666666666668 * dVar220 * dVar59 +
                  dVar208 * 15.0 * dVar220 * dVar59 +
                  dVar172 * 15.0 * dVar231 * dVar59 +
                  dVar133 * 13.333333333333334 * dVar231 * dVar59 +
                  dVar116 * 13.333333333333334 * dVar152 * dVar59 +
                  dVar149 * 11.666666666666666 * dVar152 * dVar59 +
                  dVar215 * 18.333333333333332 * dVar237 * dVar59 +
                  dVar174 * 11.666666666666666 * dVar59 * local_968 +
                  dVar26 * dVar63 * -70.0 +
                  dVar58 * dVar104 * -120.0 +
                  dVar168 * -50.0 * dVar167 +
                  dVar95 * dVar60 * 1.6666666666666667 * dVar59 +
                  dVar96 * local_a88 * dVar1 * -3.3333333333333335 * dVar111 +
                  dVar144 * dVar111 * dVar60 * -3.3333333333333335 +
                  dVar153 * 3.3333333333333335 * dVar96 * dVar59 +
                  dVar30 * 1.6666666666666667 * dVar96 * dVar59 +
                  dVar63 * 10.0 * dVar59 * local_968 +
                  dVar104 * 10.0 * local_978 * dVar59 +
                  dVar117 * 8.333333333333334 * local_978 * dVar59 +
                  dVar59 * local_b78 * dVar189 * 8.333333333333334 +
                  dVar46 * 6.666666666666667 * dVar31 * dVar59 +
                  dVar137 * 6.666666666666667 * dVar59 * local_b78) * dVar94 * dVar55 * dVar34 +
                  dVar156 * 0.0040369036088841095 * dVar175 * dVar109 +
                  (dVar25 * -0.375 * dVar151 - dVar53);
      }
      pdVar3 = out->v2rhotau;
      uVar8 = uVar2 & 0x10004;
      if (uVar8 != 0x10004 || pdVar3 == (double *)0x0) {
        local_d48 = dVar37 * dVar99 * dVar178 * -0.125;
      }
      else {
        lVar6 = (long)(p->dim).v2rhotau * sVar10;
        pdVar3[lVar6] = dVar150 * __x + dVar80 + pdVar3[lVar6];
        local_d48 = dVar37 * dVar99 * dVar178 * -0.125;
        lVar6 = (long)(p->dim).v2rhotau * sVar10;
        pdVar3[lVar6 + 1] =
             (double)(~uVar20 & (ulong)(dVar192 * dVar82 + local_d48)) * __x + dVar83 +
             pdVar3[lVar6 + 1];
        lVar6 = (long)(p->dim).v2rhotau * sVar10;
        pdVar3[lVar6 + 2] =
             (double)(~uVar19 & (ulong)(dVar224 * dVar151 - dVar53)) * __x + dVar80 +
             pdVar3[lVar6 + 2];
      }
      dVar21 = 0.0;
      if (dVar132 < local_f50) {
        dVar134 = dVar38 / dVar134;
        dVar24 = dVar134 * dVar211 * local_e18;
        dVar21 = dVar134 * dVar162 * local_e18;
        dVar53 = dVar134 * dVar233 * local_e18;
        dVar26 = dVar134 * dVar199 * local_e18;
        dVar150 = dVar134 * dVar121 * local_e18;
        dVar167 = dVar134 * dVar187 * local_e18;
        dVar25 = dVar134 * dVar222 * local_e18;
        dVar35 = dVar134 * dVar205 * local_e18;
        dVar56 = dVar134 * dVar221 * local_e18;
        dVar132 = dVar134 * dVar138 * local_e18;
        dVar21 = (dVar132 * dVar85 * -183.33333333333334 +
                  dVar124 * -183.33333333333334 * dVar21 +
                  dVar75 * -333.3333333333333 * dVar132 +
                  dVar91 * -150.0 * dVar35 +
                  dVar40 * -150.0 * dVar132 +
                  dVar182 * -270.0 * dVar35 +
                  dVar88 * -120.0 * dVar25 +
                  dVar160 * -53.333333333333336 * dVar150 +
                  dVar56 * dVar23 * -20.0 +
                  dVar120 * -20.0 * dVar150 +
                  dVar238 * -30.0 * dVar56 +
                  dVar89 * -10.0 * dVar53 +
                  dVar159 * -13.333333333333334 * dVar53 + dVar119 * -10.0 * dVar56 +
                 dVar139 * -3.3333333333333335 * dVar53 +
                 dVar123 * -120.0 * dVar35 +
                 dVar73 * -213.33333333333334 * dVar25 +
                 dVar167 * dVar87 * -93.33333333333333 +
                 dVar118 * -93.33333333333333 * dVar25 +
                 dVar193 * -163.33333333333334 * dVar167 +
                 dVar26 * dVar86 * -70.0 +
                 dVar122 * -70.0 * dVar167 +
                 dVar161 * -120.0 * dVar26 +
                 dVar29 * -50.0 * dVar24 +
                 dVar244 * -50.0 * dVar26 +
                 dVar90 * -33.333333333333336 * dVar150 + dVar107 * -83.33333333333333 * dVar24 +
                 dVar241 * -33.333333333333336 * dVar24 +
                 dVar134 * dVar22 * dVar41 * -220.0 * local_e18 +
                 dVar242 * -403.3333333333333 * dVar21 +
                 dVar60 * 1.6666666666666667 * dVar39 * dVar235 +
                 dVar60 * dVar134 * -3.3333333333333335 * dVar105 +
                 local_e18 * dVar1 * -3.3333333333333335 * dVar134 * dVar240 +
                 dVar160 * 6.666666666666667 * dVar39 * dVar221 +
                 dVar120 * 5.0 * dVar39 * dVar221 +
                 dVar238 * 5.0 * dVar39 * dVar233 +
                 dVar119 * 3.3333333333333335 * dVar39 * dVar233 +
                 dVar159 * 3.3333333333333335 * dVar39 * dVar240 +
                 dVar139 * 1.6666666666666667 * dVar39 * dVar240 +
                 dVar73 * 13.333333333333334 * dVar39 * dVar187 +
                 dVar123 * 13.333333333333334 * dVar39 * dVar222 +
                 dVar118 * 11.666666666666666 * dVar39 * dVar187 +
                 dVar193 * 11.666666666666666 * dVar39 * dVar199 +
                 dVar122 * 10.0 * dVar39 * dVar199 +
                 dVar161 * 10.0 * dVar39 * dVar211 +
                 dVar244 * 8.333333333333334 * dVar39 * dVar211 +
                 dVar107 * 8.333333333333334 * dVar39 * dVar121 +
                 dVar241 * 6.666666666666667 * dVar39 * dVar121 +
                 dVar41 * 18.333333333333332 * dVar162 * dVar39 +
                 dVar242 * 18.333333333333332 * dVar39 * dVar138 +
                 dVar124 * 16.666666666666668 * dVar39 * dVar138 +
                 dVar75 * 16.666666666666668 * dVar39 * dVar205 +
                 dVar182 * 15.0 * dVar39 * dVar222 + dVar40 * 15.0 * dVar39 * dVar205) * dVar67 *
                 dVar55 * dVar43 +
                 dVar92 * 0.0040369036088841095 * dVar76 * dVar81 +
                 dVar180 * -0.375 * dVar82 + local_d48;
      }
      if (uVar8 == 0x10004 && pdVar3 != (double *)0x0) {
        lVar6 = (long)(p->dim).v2rhotau * sVar10;
        pdVar3[lVar6 + 3] = dVar21 * __x + dVar83 + pdVar3[lVar6 + 3];
      }
      pdVar3 = out->v2sigma2;
      if (pdVar3 != (double *)0x0 && (uVar2 & 4) != 0) {
        lVar6 = (long)(p->dim).v2sigma2 * sVar10;
        dVar21 = (pdVar3 + lVar6)[1];
        dVar132 = pdVar3[lVar6 + 2];
        dVar53 = (pdVar3 + lVar6 + 2)[1];
        pdVar3[lVar6] =
             pdVar3[lVar6] +
             (double)(~uVar19 &
                     (ulong)(auVar147._8_8_ * 3.3019272488946267 * dVar135 * dVar36 * dVar100 *
                            dVar77 * 2.7692524554911753e-05)) * __x;
        (pdVar3 + lVar6)[1] = dVar21 + 0.0;
        pdVar3[lVar6 + 2] = dVar132 + 0.0;
        (pdVar3 + lVar6 + 2)[1] = dVar53 + 0.0;
        pdVar3[lVar6 + 4] = pdVar3[lVar6 + 4] + 0.0;
        lVar6 = (long)(p->dim).v2sigma2 * sVar10;
        pdVar3[lVar6 + 5] =
             (double)(~uVar20 &
                     (ulong)(dVar54 * dVar135 * (dVar218 / dVar66) * 3.3019272488946267 * dVar42 *
                            dVar184 * 2.7692524554911753e-05)) * __x + pdVar3[lVar6 + 5];
      }
      pdVar3 = out->v2sigmalapl;
      if (pdVar3 != (double *)0x0 && uVar7 == 0x8004) {
        lVar6 = (long)(p->dim).v2sigmalapl * sVar10;
        dVar21 = (pdVar3 + lVar6)[1];
        dVar132 = pdVar3[lVar6 + 2];
        dVar53 = (pdVar3 + lVar6 + 2)[1];
        dVar54 = pdVar3[lVar6 + 4];
        dVar92 = (pdVar3 + lVar6 + 4)[1];
        pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        (pdVar3 + lVar6)[1] = dVar21 + 0.0;
        pdVar3[lVar6 + 2] = dVar132 + 0.0;
        (pdVar3 + lVar6 + 2)[1] = dVar53 + 0.0;
        pdVar3[lVar6 + 4] = dVar54 + 0.0;
        (pdVar3 + lVar6 + 4)[1] = dVar92 + 0.0;
      }
      pdVar3 = out->v2sigmatau;
      if (pdVar3 != (double *)0x0 && uVar8 == 0x10004) {
        lVar6 = (long)(p->dim).v2sigmatau * sVar10;
        dVar21 = (pdVar3 + lVar6)[1];
        dVar132 = pdVar3[lVar6 + 2];
        dVar53 = (pdVar3 + lVar6 + 2)[1];
        pdVar3[lVar6] =
             pdVar3[lVar6] + (double)(~uVar19 & (ulong)(dVar129 * dVar234 * dVar109)) * __x;
        (pdVar3 + lVar6)[1] = dVar21 + 0.0;
        pdVar3[lVar6 + 2] = dVar132 + 0.0;
        (pdVar3 + lVar6 + 2)[1] = dVar53 + 0.0;
        pdVar3[lVar6 + 4] = pdVar3[lVar6 + 4] + 0.0;
        lVar6 = (long)(p->dim).v2sigmatau * sVar10;
        pdVar3[lVar6 + 5] =
             (double)(~uVar20 & (ulong)(dVar49 * dVar48 * dVar81)) * __x + pdVar3[lVar6 + 5];
      }
      pdVar3 = out->v2lapl2;
      if (pdVar3 != (double *)0x0 && uVar7 == 0x8004) {
        lVar6 = (long)(p->dim).v2lapl2 * sVar10;
        dVar21 = (pdVar3 + lVar6)[1];
        pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        (pdVar3 + lVar6)[1] = dVar21 + 0.0;
        pdVar3[lVar6 + 2] = pdVar3[lVar6 + 2] + 0.0;
      }
      pdVar3 = out->v2lapltau;
      if ((uVar5 & 0x18004) == 0 && pdVar3 != (double *)0x0) {
        lVar6 = (long)(p->dim).v2lapltau * sVar10;
        dVar21 = (pdVar3 + lVar6)[1];
        dVar132 = pdVar3[lVar6 + 2];
        dVar53 = (pdVar3 + lVar6 + 2)[1];
        pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        (pdVar3 + lVar6)[1] = dVar21 + 0.0;
        pdVar3[lVar6 + 2] = dVar132 + 0.0;
        (pdVar3 + lVar6 + 2)[1] = dVar53 + 0.0;
      }
      pdVar3 = out->v2tau2;
      if (pdVar3 != (double *)0x0 && uVar8 == 0x10004) {
        dVar27 = dVar27 / dVar173;
        dVar152 = dVar152 * dVar27;
        local_968 = local_968 * dVar27;
        dVar203 = dVar203 * dVar27;
        local_978 = local_978 * dVar27;
        dVar220 = dVar220 * dVar27;
        local_b78 = local_b78 * dVar27;
        dVar231 = dVar231 * dVar27;
        dVar31 = dVar31 * dVar27;
        dVar61 = dVar61 * dVar27;
        lVar6 = (long)(p->dim).v2tau2 * sVar10;
        dVar21 = (pdVar3 + lVar6)[1];
        pdVar3[lVar6] =
             (double)(~uVar19 &
                     (ulong)(dVar34 * dVar94 * (dVar237 * dVar27 * dVar128 * 242.0 +
                                                dVar203 * dVar186 * 110.0 +
                                                dVar188 * 200.0 * dVar203 +
                                                dVar220 * dVar133 * 72.0 +
                                                dVar148 * 90.0 * dVar220 +
                                                dVar172 * 162.0 * dVar220 +
                                                dVar231 * dVar149 * 56.0 +
                                                dVar33 * 72.0 * dVar231 +
                                                dVar116 * 128.0 * dVar231 +
                                                dVar152 * dVar62 * 56.0 +
                                                dVar61 * dVar209 * 6.0 +
                                                dVar237 * dVar27 * dVar64 * 110.0 +
                                                dVar203 * dVar208 * 90.0 +
                                                dVar96 * (dVar1 + dVar1) * dVar27 +
                                                dVar27 * dVar28 * dVar215 * 132.0 +
                                                dVar96 * (dVar60 + dVar60) * dVar27 +
                                               dVar152 * dVar63 * 42.0 +
                                               dVar152 * dVar174 * 98.0 +
                                               dVar136 * 42.0 * local_968 +
                                               local_968 * dVar117 * 30.0 +
                                               dVar104 * 72.0 * local_968 +
                                               dVar168 * 30.0 * local_978 +
                                               local_978 * dVar137 * 20.0 +
                                               dVar189 * 50.0 * local_978 +
                                               dVar210 * 20.0 * local_b78 +
                                               local_b78 * dVar32 * 12.0 +
                                               local_b78 * dVar46 * 32.0 +
                                               dVar31 * dVar198 * 12.0 +
                                               dVar31 * dVar204 * 6.0 +
                                               dVar154 * 18.0 * dVar31 +
                                               dVar61 * dVar153 * 8.0 + (dVar30 + dVar30) * dVar61)
                                      * dVar55)) * __x + pdVar3[lVar6];
        (pdVar3 + lVar6)[1] = dVar21 + 0.0;
        dVar38 = dVar38 / dVar74;
        dVar138 = dVar138 * dVar38;
        dVar211 = dVar211 * dVar38;
        dVar199 = dVar199 * dVar38;
        dVar187 = dVar187 * dVar38;
        dVar222 = dVar222 * dVar38;
        dVar233 = dVar233 * dVar38;
        dVar221 = dVar221 * dVar38;
        dVar121 = dVar121 * dVar38;
        dVar205 = dVar205 * dVar38;
        lVar6 = (long)(p->dim).v2tau2 * sVar10;
        pdVar3[lVar6 + 2] =
             (double)(~uVar20 &
                     (ulong)(dVar43 * dVar67 * (dVar162 * dVar38 * dVar242 * 242.0 +
                                                dVar124 * 110.0 * dVar162 * dVar38 +
                                                dVar244 * 30.0 * dVar199 +
                                                dVar107 * 50.0 * dVar211 +
                                                dVar160 * 32.0 * dVar121 +
                                                dVar238 * 18.0 * dVar221 +
                                                dVar159 * 8.0 * dVar233 +
                                                dVar75 * 200.0 * dVar138 +
                                                dVar40 * 90.0 * dVar138 +
                                                dVar241 * 20.0 * dVar211 +
                                                dVar120 * 12.0 * dVar121 +
                                                dVar119 * 6.0 * dVar221 +
                                                (dVar139 + dVar139) * dVar233 +
                                                (dVar1 + dVar1) * dVar38 * dVar240 +
                                                dVar22 * dVar41 * 132.0 * dVar38 +
                                                (dVar60 + dVar60) * dVar38 * dVar240 +
                                               dVar187 * dVar193 * 98.0 +
                                               dVar122 * 42.0 * dVar187 +
                                               dVar161 * 72.0 * dVar199 +
                                               dVar205 * dVar182 * 162.0 +
                                               dVar123 * 72.0 * dVar205 +
                                               dVar222 * dVar73 * 128.0 +
                                               dVar118 * 56.0 * dVar222 +
                                               dVar91 * 90.0 * dVar205 +
                                               dVar90 * 20.0 * dVar121 +
                                               dVar23 * 12.0 * dVar221 +
                                               dVar89 * 6.0 * dVar233 +
                                               dVar88 * 72.0 * dVar222 +
                                               dVar87 * 56.0 * dVar187 +
                                               dVar86 * 42.0 * dVar199 +
                                               dVar85 * 110.0 * dVar138 + dVar29 * 30.0 * dVar211) *
                                      dVar55)) * __x + pdVar3[lVar6 + 2];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}